

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O2

FastString __thiscall Strings::unquotedPrintable(Strings *this,FastString *textToUnquote)

{
  bool bVar1;
  uchar *extraout_RDX;
  uchar *puVar2;
  FastString FVar3;
  char ch;
  char *text;
  FastString out;
  QuotedDecoding dec;
  char local_51;
  uchar *local_50;
  String local_48;
  QuotedDecoding local_38;
  
  Bstrlib::String::String(&local_48);
  local_50 = (textToUnquote->super_tagbstring).data;
  puVar2 = local_50 + (textToUnquote->super_tagbstring).slen;
  local_38.out = &local_48;
  do {
    if (puVar2 <= local_50) {
      Bstrlib::String::String((String *)this,&local_48);
LAB_0010d3f1:
      Bstrlib::String::~String(&local_48);
      FVar3.super_tagbstring.data = extraout_RDX;
      FVar3.super_tagbstring._0_8_ = this;
      return (FastString)FVar3.super_tagbstring;
    }
    local_51 = '\0';
    bVar1 = QuotedDecoding::unquoteChar(&local_38,(char **)&local_50,&local_51);
    if (!bVar1) {
      Bstrlib::String::String((String *)this,"");
      goto LAB_0010d3f1;
    }
    Bstrlib::String::operator+=(&local_48,local_51);
  } while( true );
}

Assistant:

FastString unquotedPrintable(const FastString & textToUnquote)
    {
        FastString out; QuotedDecoding dec(out);
        const char * text = (const char *)textToUnquote, *end = text + textToUnquote.getLength();
        while (text < end)
        {
            char ch = 0;
            if (!dec.unquoteChar(text, ch)) return "";
            out += ch;
        }
        return out;
    }